

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aura.c
# Opt level: O1

int aura_wait_status_timeout(aura_node *node,int status,timeval *timeout)

{
  void *pvVar1;
  _func_void_aura_node_ptr_int_void_ptr *p_Var2;
  aura_eventloop *loop;
  undefined1 local_34 [4];
  
  loop = (aura_eventloop *)aura_node_eventloop_get_autocreate(node);
  pvVar1 = node->status_changed_arg;
  p_Var2 = node->status_changed_cb;
  node->status_changed_arg = local_34;
  node->status_changed_cb = wait_status_changed_cb;
  if (timeout != (timeval *)0x0) {
    aura_eventloop_loopexit(loop,timeout);
  }
  aura_eventloop_dispatch(loop,0);
  node->status_changed_arg = pvVar1;
  node->status_changed_cb = p_Var2;
  return node->status;
}

Assistant:

int aura_wait_status_timeout(struct aura_node *node, int status, struct timeval *timeout)
{
	struct aura_eventloop *loop = aura_node_eventloop_get_autocreate(node);
	/* Save current callbacks/args */
	void *cb = node->status_changed_cb;
	void *arg = node->status_changed_arg;
	aura_status_changed_cb(node, wait_status_changed_cb, &status);
	if (timeout)
		aura_eventloop_loopexit(loop, timeout);
	aura_eventloop_dispatch(loop, 0);
	/* restore user callback, if any */
	aura_status_changed_cb(node, cb, arg);
	return aura_get_status(node);
}